

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __n;
  undefined8 *puVar6;
  upb_MiniTableField *puVar7;
  upb_Message_Internal *in;
  uint *puVar8;
  upb_Message_Internal *in_00;
  upb_MiniTableField *field;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  upb_MiniTableExtension *puVar12;
  char *__dest;
  long *plVar13;
  _upb_sortedmap sorted;
  _upb_sortedmap local_5c;
  upb_encstate *local_50;
  char *local_48;
  char *local_40;
  size_t *local_38;
  
  pcVar4 = e->ptr;
  local_48 = e->limit;
  if (((e->options & 4U) != 0) &&
     (bVar1 = m->required_count_dont_copy_me__upb_internal_use_only, bVar1 != 0)) {
    if (0x40 < bVar1) {
      __assert_fail("0 < n && n <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                    ,0xb3,
                    "uint64_t _upb_MiniTable_RequiredMask_dont_copy_me__upb_internal_use_only(const struct upb_MiniTable *)"
                   );
    }
    if ((-1L << (bVar1 & 0x3f) | msg[1].field_0.internal_opaque) != 0xffffffffffffffff) {
      encode_err(e,kUpb_EncodeStatus_MissingRequired);
    }
  }
  local_38 = size;
  if (((e->options & 2U) == 0) &&
     (puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe), puVar8 != (uint *)0x0)
     ) {
    uVar11 = 0;
    uVar9 = 0;
    while (uVar9 < *puVar8) {
      uVar5 = *(ulong *)(puVar8 + uVar9 * 2 + 2);
      uVar9 = uVar9 + 1;
      if ((uVar5 & 1) == 0 && uVar5 != 0) {
        uVar11 = uVar11 + *(long *)((uVar5 & 0xfffffffffffffffc) + 8);
      }
    }
    if (uVar11 != 0) {
      if ((ulong)((long)pcVar4 - (long)e->buf) < uVar11) {
        encode_growbuffer(e,uVar11);
        __dest = e->ptr;
      }
      else {
        __dest = pcVar4 + -uVar11;
        e->ptr = __dest;
      }
      puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
      if (puVar8 != (uint *)0x0) {
        uVar9 = 0;
        do {
          do {
            if (*puVar8 <= uVar9) goto LAB_002872eb;
            uVar11 = *(ulong *)(puVar8 + uVar9 * 2 + 2);
            uVar9 = uVar9 + 1;
          } while ((uVar11 & 1) != 0 || uVar11 == 0);
          __n = ((undefined8 *)(uVar11 & 0xfffffffffffffffc))[1];
          memcpy(__dest,*(void **)(uVar11 & 0xfffffffffffffffc),__n);
          __dest = __dest + __n;
          puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
        } while (puVar8 != (uint *)0x0);
      }
    }
  }
LAB_002872eb:
  local_40 = pcVar4;
  if ((m->ext_dont_copy_me__upb_internal_use_only != '\0') &&
     (in_00 = (upb_Message_Internal *)((msg->field_0).internal_opaque & 0xfffffffffffffffe),
     in_00 != (upb_Message_Internal *)0x0)) {
    uVar3 = in_00->size;
    if ((ulong)uVar3 != 0) {
      uVar9 = 0xffffffffffffffff;
      local_50 = e;
LAB_00287332:
      if (((ulong)in_00[(ulong)(uVar3 - 1) + uVar9 + 2] & 1) == 0) goto LAB_00287395;
      plVar13 = (long *)((ulong)in_00[(ulong)(uVar3 - 1) + uVar9 + 2] & 0xfffffffffffffffc);
      puVar12 = (upb_MiniTableExtension *)*plVar13;
      switch((puVar12->field_dont_copy_me__upb_internal_use_only).
             mode_dont_copy_me__upb_internal_use_only & 3) {
      case 0:
        lVar10 = plVar13[1];
        if (*(char *)(lVar10 + 3) == '\x01') {
          uVar11 = (ulong)*(uint *)(lVar10 + 0x10);
        }
        else {
          uVar11 = upb_inttable_count((upb_inttable *)(lVar10 + 8));
          e = local_50;
        }
        if (uVar11 == 0) goto LAB_00287395;
        puVar12 = (upb_MiniTableExtension *)*plVar13;
        break;
      case 1:
        if (*(long *)(plVar13[1] + 8) == 0) goto LAB_00287395;
        break;
      case 3:
switchD_00287353_caseD_3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                      ,0x3f,
                      "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                     );
      }
      if ((e->options & 1) != 0) {
        _upb_mapsorter_pushexts(&e->sorter,in_00,&local_5c);
        if (local_5c.pos != local_5c.end) {
          do {
            puVar6 = (undefined8 *)(e->sorter).entries[local_5c.pos];
            local_5c.pos = local_5c.pos + 1;
            encode_ext(e,(upb_MiniTableExtension *)*puVar6,*(upb_MessageValue *)(puVar6 + 1),
                       m->ext_dont_copy_me__upb_internal_use_only == '\x02');
          } while (local_5c.pos != local_5c.end);
        }
        (e->sorter).size = local_5c.start;
        goto LAB_00287524;
      }
      encode_ext(e,puVar12,*(upb_MessageValue *)(plVar13 + 1),
                 m->ext_dont_copy_me__upb_internal_use_only == '\x02');
      uVar11 = (msg->field_0).internal_opaque;
      goto joined_r0x002873e4;
    }
  }
LAB_00287524:
  pcVar4 = local_40;
  if (m->field_count_dont_copy_me__upb_internal_use_only != 0) {
    puVar7 = m->fields_dont_copy_me__upb_internal_use_only;
    lVar10 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only * 0xc;
    do {
      field = (upb_MiniTableField *)
              ((long)&puVar7[-1].number_dont_copy_me__upb_internal_use_only + lVar10);
      uVar2 = *(ushort *)((long)puVar7 + lVar10 + -6);
      if (uVar2 == 0) {
        (*(code *)(&DAT_0039f7c0 +
                  *(int *)(&DAT_0039f7c0 + (ulong)(*(byte *)((long)puVar7 + lVar10 + -1) >> 6) * 4))
        )();
        return;
      }
      if ((short)uVar2 < 1) {
        if (*(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) ==
            field->number_dont_copy_me__upb_internal_use_only) goto LAB_00287575;
      }
      else if ((*(byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) != 0) {
LAB_00287575:
        encode_field(e,msg,m->subs_dont_copy_me__upb_internal_use_only,field);
      }
      lVar10 = lVar10 + -0xc;
    } while (lVar10 != 0);
  }
  *local_38 = (long)(pcVar4 + (long)e->limit) - (long)(local_48 + (long)e->ptr);
  return;
LAB_00287395:
  lVar10 = uVar3 + uVar9;
  uVar9 = uVar9 - 1;
  if (lVar10 == 0) goto LAB_00287524;
  goto LAB_00287332;
joined_r0x002873e4:
  puVar8 = (uint *)(uVar11 & 0xfffffffffffffffe);
  if (puVar8 == (uint *)0x0) goto LAB_00287524;
  uVar3 = *puVar8;
  if ((ulong)uVar3 <= -uVar9) goto LAB_00287524;
  uVar9 = ~-uVar9;
LAB_0028740d:
  if ((*(ulong *)(puVar8 + (ulong)(uVar3 - 1) * 2 + uVar9 * 2 + 4) & 1) == 0) {
LAB_00287465:
    lVar10 = uVar3 + uVar9;
    uVar9 = uVar9 - 1;
    if (lVar10 == 0) goto LAB_00287524;
    goto LAB_0028740d;
  }
  plVar13 = (long *)(*(ulong *)(puVar8 + (ulong)(uVar3 - 1) * 2 + uVar9 * 2 + 4) &
                    0xfffffffffffffffc);
  puVar12 = (upb_MiniTableExtension *)*plVar13;
  switch((puVar12->field_dont_copy_me__upb_internal_use_only).
         mode_dont_copy_me__upb_internal_use_only & 3) {
  case 0:
    lVar10 = plVar13[1];
    if (*(char *)(lVar10 + 3) == '\x01') {
      uVar11 = (ulong)*(uint *)(lVar10 + 0x10);
    }
    else {
      uVar11 = upb_inttable_count((upb_inttable *)(lVar10 + 8));
    }
    if (uVar11 == 0) goto LAB_00287465;
    puVar12 = (upb_MiniTableExtension *)*plVar13;
switchD_0028742e_caseD_2:
    encode_ext(e,puVar12,*(upb_MessageValue *)(plVar13 + 1),
               m->ext_dont_copy_me__upb_internal_use_only == '\x02');
    uVar11 = (msg->field_0).internal_opaque;
    break;
  case 1:
    if (*(long *)(plVar13[1] + 8) != 0) goto switchD_0028742e_caseD_2;
    goto LAB_00287465;
  case 2:
    goto switchD_0028742e_caseD_2;
  case 3:
    goto switchD_00287353_caseD_3;
  }
  goto joined_r0x002873e4;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size = 0;
    uintptr_t iter = kUpb_Message_UnknownBegin;
    upb_StringView unknown;
    // Need to write in reverse order, but iteration is in-order; scan to
    // reserve capacity up front, then write in-order
    while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
      unknown_size += unknown.size;
    }
    if (unknown_size != 0) {
      encode_reserve(e, unknown_size);
      char* ptr = e->ptr;
      iter = kUpb_Message_UnknownBegin;
      while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
        memcpy(ptr, unknown.data, unknown.size);
        ptr += unknown.size;
      }
    }
  }

  encode_exts(e, m, msg);

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}